

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall
BCLog::Logger::LogPrintStr_
          (Logger *this,string_view str,string_view logging_function,string_view source_file,
          int source_line,LogFlags category,Level level)

{
  long lVar1;
  string_view str_00;
  string_view str_01;
  string_view source_file_00;
  string_view logging_function_00;
  string_view threadname;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  size_t sVar5;
  char *__ptr;
  FILE *__stream;
  value_type *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Level in_R9D;
  long in_FS_OFFSET;
  __sv_type _Var6;
  FILE *new_fileout;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *cb;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *__range1;
  bool starts_new_line;
  iterator __end1;
  iterator __begin1;
  BufferedLog buf;
  string str_prefixed;
  Level in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  value_type *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd80;
  BufferedLog *in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  LogFlags in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  Logger *in_stack_fffffffffffffde8;
  rep local_1c8;
  time_point in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *local_158;
  BufferedLog *pBStack_150;
  allocator<char> local_122;
  allocator<char> local_121 [17];
  int source_line_00;
  value_type *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_01._M_str = in_stack_fffffffffffffdc8;
  str_01._M_len = in_stack_fffffffffffffdc0;
  LogEscapeMessage_abi_cxx11_(str_01);
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd80);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_158 = in_stack_fffffffffffffd80;
  pBStack_150 = in_stack_fffffffffffffd88;
  if (!bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    std::basic_string_view<char,_std::char_traits<char>_>::operator[]
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd78,
               (size_type)in_stack_fffffffffffffd70);
    local_158 = in_stack_fffffffffffffd80;
    pBStack_150 = in_stack_fffffffffffffd88;
  }
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),false);
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    if (bVar2) {
      pvVar7 = in_RCX;
      pbVar8 = in_R8;
      util::ThreadGetInternalName_abi_cxx11_();
      source_line_00 = (int)pvVar7;
      _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pBStack_150);
      std::chrono::_V2::system_clock::now();
      in_stack_fffffffffffffd68 = in_R9D;
      GetMockTime();
      local_158 = (basic_string_view<char,_std::char_traits<char>_> *)_Var6._M_len;
      pBStack_150 = (BufferedLog *)_Var6._M_str;
      source_file_00._M_str = in_stack_fffffffffffffe58;
      source_file_00._M_len = in_stack_fffffffffffffe50;
      logging_function_00._M_str = in_RSI;
      logging_function_00._M_len = (size_t)pbVar8;
      threadname._M_str = in_stack_ffffffffffffff10;
      threadname._M_len = in_RDX;
      FormatLogStrInPlace(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8,in_stack_fffffffffffffd68,source_file_00,
                          source_line_00,logging_function_00,threadname,in_stack_fffffffffffffe48,
                          (seconds)local_1c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      in_stack_fffffffffffffd70 = in_RCX;
      in_stack_fffffffffffffd78 = in_R8;
    }
    if ((*(byte *)(in_RDI + 0xd0) & 1) != 0) {
      __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      fwrite(__ptr,1,sVar4,_stdout);
      fflush(_stdout);
    }
    std::__cxx11::
    list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::begin((list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
             *)in_stack_fffffffffffffd70);
    std::__cxx11::
    list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::end((list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
           *)in_stack_fffffffffffffd70);
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffd78,
                                   (_Self *)in_stack_fffffffffffffd70), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      std::
      _List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::operator*((_List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                   *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)in_stack_fffffffffffffd78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70);
      std::
      _List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::operator++((_List_iterator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    if ((*(byte *)(in_RDI + 0xd1) & 1) != 0) {
      if (*(long *)(in_RDI + 0x28) == 0) {
        __assert_fail("m_fileout != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                      ,0x1c3,
                      "void BCLog::Logger::LogPrintStr_(std::string_view, std::string_view, std::string_view, int, BCLog::LogFlags, BCLog::Level)"
                     );
      }
      bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)local_158);
      if (bVar2) {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   false);
        __stream = fsbridge::fopen((char *)(in_RDI + 0xd8),"a");
        if (__stream != (FILE *)0x0) {
          setbuf(__stream,(char *)0x0);
          fclose(*(FILE **)(in_RDI + 0x28));
          *(FILE **)(in_RDI + 0x28) = __stream;
        }
      }
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBStack_150);
      str_00._M_str = (char *)pBStack_150;
      str_00._M_len = (size_t)local_158;
      FileWriteStr(str_00,(FILE *)in_stack_fffffffffffffd78);
    }
  }
  else {
    if (!bVar2) {
      bVar2 = std::__cxx11::
              list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::empty
                        ((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                          *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (!bVar2) {
        std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
        ::back((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *)
               in_stack_fffffffffffffd70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (in_stack_fffffffffffffd78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70);
        sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        *(size_type *)(in_RDI + 0x58) = sVar4 + *(long *)(in_RDI + 0x58);
        goto LAB_01b07c42;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(char *)pBStack_150);
    }
    std::chrono::_V2::system_clock::now();
    GetMockTime();
    std::__cxx11::string::string(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBStack_150,
               local_158,(allocator<char> *)in_stack_fffffffffffffd78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBStack_150,
               local_158,(allocator<char> *)in_stack_fffffffffffffd78);
    util::ThreadGetInternalName_abi_cxx11_();
    std::allocator<char>::~allocator(&local_122);
    std::allocator<char>::~allocator(local_121);
    sVar5 = MemUsage(pBStack_150);
    *(size_t *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + sVar5;
    std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
    push_back((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *)
              in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    BufferedLog::~BufferedLog
              ((BufferedLog *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    while (*(ulong *)(in_RDI + 0x50) < *(ulong *)(in_RDI + 0x58)) {
      bVar2 = std::__cxx11::
              list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::empty
                        ((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                          *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (bVar2) {
        *(undefined8 *)(in_RDI + 0x58) = 0;
        break;
      }
      std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
      front((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *)
            in_stack_fffffffffffffd70);
      sVar5 = MemUsage(pBStack_150);
      *(size_t *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) - sVar5;
      std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
      pop_front((list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *)
                in_stack_fffffffffffffd78);
      *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    }
  }
LAB_01b07c42:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BCLog::Logger::LogPrintStr_(std::string_view str, std::string_view logging_function, std::string_view source_file, int source_line, BCLog::LogFlags category, BCLog::Level level)
{
    std::string str_prefixed = LogEscapeMessage(str);

    const bool starts_new_line = m_started_new_line;
    m_started_new_line = !str.empty() && str[str.size()-1] == '\n';

    if (m_buffering) {
        if (!starts_new_line) {
            if (!m_msgs_before_open.empty()) {
                m_msgs_before_open.back().str += str_prefixed;
                m_cur_buffer_memusage += str_prefixed.size();
                return;
            } else {
                // unlikely edge case; add a marker that something was trimmed
                str_prefixed.insert(0, "[...] ");
            }
        }

        {
            BufferedLog buf{
                .now=SystemClock::now(),
                .mocktime=GetMockTime(),
                .str=str_prefixed,
                .logging_function=std::string(logging_function),
                .source_file=std::string(source_file),
                .threadname=util::ThreadGetInternalName(),
                .source_line=source_line,
                .category=category,
                .level=level,
            };
            m_cur_buffer_memusage += MemUsage(buf);
            m_msgs_before_open.push_back(std::move(buf));
        }

        while (m_cur_buffer_memusage > m_max_buffer_memusage) {
            if (m_msgs_before_open.empty()) {
                m_cur_buffer_memusage = 0;
                break;
            }
            m_cur_buffer_memusage -= MemUsage(m_msgs_before_open.front());
            m_msgs_before_open.pop_front();
            ++m_buffer_lines_discarded;
        }

        return;
    }

    if (starts_new_line) {
        FormatLogStrInPlace(str_prefixed, category, level, source_file, source_line, logging_function, util::ThreadGetInternalName(), SystemClock::now(), GetMockTime());
    }

    if (m_print_to_console) {
        // print to console
        fwrite(str_prefixed.data(), 1, str_prefixed.size(), stdout);
        fflush(stdout);
    }
    for (const auto& cb : m_print_callbacks) {
        cb(str_prefixed);
    }
    if (m_print_to_file) {
        assert(m_fileout != nullptr);

        // reopen the log file, if requested
        if (m_reopen_file) {
            m_reopen_file = false;
            FILE* new_fileout = fsbridge::fopen(m_file_path, "a");
            if (new_fileout) {
                setbuf(new_fileout, nullptr); // unbuffered
                fclose(m_fileout);
                m_fileout = new_fileout;
            }
        }
        FileWriteStr(str_prefixed, m_fileout);
    }
}